

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

void FACT_INTERNAL_OnBufferEnd(FAudioVoiceCallback *callback,void *pContext)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  uint8_t **packetBuffer;
  uint32_t in_ESI;
  long in_RDI;
  uint32_t length;
  uint32_t left;
  uint32_t end;
  FACTWaveBankEntry *entry;
  FACTWaveCallback *c;
  FAudioBufferWMA bufferWMA;
  FAudioBuffer buffer;
  uint local_70;
  int local_6c;
  void *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  void *in_stack_ffffffffffffffe0;
  
  packetBuffer = (uint8_t **)
                 (*(long *)(**(long **)(in_RDI + 0x38) + 0x38) +
                 (ulong)*(ushort *)(*(long *)(in_RDI + 0x38) + 0x10) * 0x18);
  if ((*(char *)(*(long *)(in_RDI + 0x38) + 0x2a) == '\0') ||
     (*(int *)((long)packetBuffer + 0x14) == 0)) {
    local_6c = *(int *)((long)packetBuffer + 0xc);
  }
  else {
    uVar3 = *(int *)(packetBuffer + 2) + *(int *)((long)packetBuffer + 0x14);
    if (((ulong)*packetBuffer & 0x300000000) == 0) {
      local_6c = uVar3 * (*(uint *)((long)packetBuffer + 4) >> 2 & 7) *
                 (1 << (byte)((uint)*(undefined4 *)((long)packetBuffer + 4) >> 0x1f));
    }
    else if (((ulong)*packetBuffer & 0x300000000) == 0x200000000) {
      local_6c = (uVar3 / (((*(uint *)((long)packetBuffer + 4) >> 0x17 & 0xff) + 0x10) * 2)) *
                 ((*(uint *)((long)packetBuffer + 4) >> 0x17 & 0xff) + 0x16) *
                 (*(uint *)((long)packetBuffer + 4) >> 2 & 7);
    }
    else {
      local_6c = *(int *)((long)packetBuffer + 0xc);
    }
  }
  iVar1 = *(int *)(packetBuffer + 1);
  local_70 = local_6c - (*(int *)(*(long *)(in_RDI + 0x38) + 0x30) - *(int *)(packetBuffer + 1));
  if ((*(uint *)(*(long *)(in_RDI + 0x38) + 0x30) < (uint)(iVar1 + local_6c)) &&
     ((*(uint *)(*(long *)(in_RDI + 0x38) + 0x20) & 0x20) == 0)) {
    uVar2 = *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x38);
    uVar5 = (undefined4)uVar2;
    uVar3 = (uint)((ulong)uVar2 >> 0x20);
    if (*(uint *)(*(long *)(in_RDI + 0x38) + 0x2c) < local_70) {
      local_70 = *(uint *)(*(long *)(in_RDI + 0x38) + 0x2c);
    }
    FACT_INTERNAL_ReadFile
              ((FACTReadFileCallback)CONCAT44(uVar5,local_70),
               (FACTGetOverlappedResultCallback)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               in_stack_ffffffffffffffb0,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,
               packetBuffer,
               (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (FAudioReallocFunc)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffe0,in_ESI);
    *(uint *)(*(long *)(in_RDI + 0x38) + 0x30) =
         local_70 + *(int *)(*(long *)(in_RDI + 0x38) + 0x30);
    uVar4 = 0;
    if ((uint)(iVar1 + local_6c) <= *(uint *)(*(long *)(in_RDI + 0x38) + 0x30)) {
      if (*(char *)(*(long *)(in_RDI + 0x38) + 0x2a) == '\0') {
        uVar4 = 0x40;
      }
      else {
        if (*(char *)(*(long *)(in_RDI + 0x38) + 0x2a) != -1) {
          *(char *)(*(long *)(in_RDI + 0x38) + 0x2a) =
               *(char *)(*(long *)(in_RDI + 0x38) + 0x2a) + -1;
        }
        *(undefined4 *)(*(long *)(in_RDI + 0x38) + 0x30) = *(undefined4 *)(packetBuffer + 1);
        if (((ulong)*packetBuffer & 0x300000000) == 0) {
          *(uint *)(*(long *)(in_RDI + 0x38) + 0x30) =
               *(int *)(packetBuffer + 2) * (*(uint *)((long)packetBuffer + 4) >> 2 & 7) *
               (1 << (byte)((uint)*(undefined4 *)((long)packetBuffer + 4) >> 0x1f)) +
               *(int *)(*(long *)(in_RDI + 0x38) + 0x30);
        }
        else if (((ulong)*packetBuffer & 0x300000000) == 0x200000000) {
          *(uint *)(*(long *)(in_RDI + 0x38) + 0x30) =
               (*(uint *)(packetBuffer + 2) /
               (((*(uint *)((long)packetBuffer + 4) >> 0x17 & 0xff) + 0x10) * 2)) *
               ((*(uint *)((long)packetBuffer + 4) >> 0x17 & 0xff) + 0x16) *
               (*(uint *)((long)packetBuffer + 4) >> 2 & 7) +
               *(int *)(*(long *)(in_RDI + 0x38) + 0x30);
        }
      }
    }
    if (((ulong)*packetBuffer & 0x300000000) == 0x300000000) {
      FAudioSourceVoice_SubmitSourceBuffer
                ((FAudioSourceVoice *)(ulong)uVar3,(FAudioBuffer *)CONCAT44(uVar5,local_70),
                 (FAudioBufferWMA *)
                 CONCAT44(uVar4,*(undefined4 *)
                                 (*(long *)(**(long **)(in_RDI + 0x38) + 0x48) +
                                 (ulong)*(ushort *)(*(long *)(in_RDI + 0x38) + 0x10) * 0x10)));
    }
    else {
      FAudioSourceVoice_SubmitSourceBuffer
                ((FAudioSourceVoice *)(ulong)uVar3,(FAudioBuffer *)CONCAT44(uVar5,local_70),
                 (FAudioBufferWMA *)CONCAT44(uVar4,in_stack_ffffffffffffffb8));
    }
  }
  return;
}

Assistant:

void FACT_INTERNAL_OnBufferEnd(FAudioVoiceCallback *callback, void* pContext)
{
	FAudioBuffer buffer;
	FAudioBufferWMA bufferWMA;
	FACTWaveCallback *c = (FACTWaveCallback*) callback;
	FACTWaveBankEntry *entry;
	uint32_t end, left, length;

	entry = &c->wave->parentBank->entries[c->wave->index];

	/* Calculate total bytes left in this wave iteration */
	if (c->wave->loopCount > 0 && entry->LoopRegion.dwTotalSamples > 0)
	{
		length = entry->LoopRegion.dwStartSample + entry->LoopRegion.dwTotalSamples;
		if (entry->Format.wFormatTag == 0x0)
		{
			length = (
				length *
				entry->Format.nChannels *
				(1 << entry->Format.wBitsPerSample)
			);
		}
		else if (entry->Format.wFormatTag == 0x2)
		{
			length = (
				length /
				/* wSamplesPerBlock */
				((entry->Format.wBlockAlign + 16) * 2) *
				/* nBlockAlign */
				((entry->Format.wBlockAlign + 22) * entry->Format.nChannels)
			);
		}
		else
		{
			length = entry->PlayRegion.dwLength;
		}
	}
	else
	{
		length = entry->PlayRegion.dwLength;
	}
	end = entry->PlayRegion.dwOffset + length;
	left = length - (c->wave->streamOffset - entry->PlayRegion.dwOffset);

	/* Don't bother if we're EOS or the Wave has stopped */
	if (	(c->wave->streamOffset >= end) ||
		(c->wave->state & FACT_STATE_STOPPED)	)
	{
		return;
	}

	/* Assign buffer memory */
	buffer.pAudioData = c->wave->streamCache;
	buffer.AudioBytes = FAudio_min(
		c->wave->streamSize,
		left
	);

	/* Read! */
	FACT_INTERNAL_ReadFile(
		c->wave->parentBank->parentEngine->pReadFile,
		c->wave->parentBank->parentEngine->pGetOverlappedResult,
		c->wave->parentBank->io,
		c->wave->streamOffset,
		c->wave->parentBank->packetSize,
		&c->wave->parentBank->packetBuffer,
		&c->wave->parentBank->packetBufferLen,
		c->wave->parentBank->parentEngine->pRealloc,
		c->wave->streamCache,
		buffer.AudioBytes
	);
	c->wave->streamOffset += buffer.AudioBytes;

	/* Last buffer in the stream? */
	buffer.Flags = 0;
	if (c->wave->streamOffset >= end)
	{
		/* Loop if applicable */
		if (c->wave->loopCount > 0)
		{
			if (c->wave->loopCount != 255)
			{
				c->wave->loopCount -= 1;
			}
			c->wave->streamOffset = entry->PlayRegion.dwOffset;

			/* Loop start */
			if (entry->Format.wFormatTag == 0x0)
			{
				c->wave->streamOffset += (
					entry->LoopRegion.dwStartSample *
					entry->Format.nChannels *
					(1 << entry->Format.wBitsPerSample)
				);
			}
			else if (entry->Format.wFormatTag == 0x2)
			{
				c->wave->streamOffset += (
					entry->LoopRegion.dwStartSample /
					/* wSamplesPerBlock */
					((entry->Format.wBlockAlign + 16) * 2) *
					/* nBlockAlign */
					((entry->Format.wBlockAlign + 22) * entry->Format.nChannels)
				);
			}
		}
		else
		{
			buffer.Flags = FAUDIO_END_OF_STREAM;
		}
	}

	/* Unused properties */
	buffer.PlayBegin = 0;
	buffer.PlayLength = 0;
	buffer.LoopBegin = 0;
	buffer.LoopLength = 0;
	buffer.LoopCount = 0;
	buffer.pContext = NULL;

	/* Submit, finally. */
	if (entry->Format.wFormatTag == 0x3)
	{
		bufferWMA.pDecodedPacketCumulativeBytes =
			c->wave->parentBank->seekTables[c->wave->index].entries;
		bufferWMA.PacketCount =
			c->wave->parentBank->seekTables[c->wave->index].entryCount;
		FAudioSourceVoice_SubmitSourceBuffer(
			c->wave->voice,
			&buffer,
			&bufferWMA
		);
	}
	else
	{
		FAudioSourceVoice_SubmitSourceBuffer(
			c->wave->voice,
			&buffer,
			NULL
		);
	}
}